

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O3

int __thiscall Hypergraph::extendable(Hypergraph *this,edge *x,edge *y)

{
  ulong uVar1;
  uint uVar2;
  pointer puVar3;
  pointer pvVar4;
  edge *e_00;
  uint uVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  rep rVar11;
  long lVar12;
  ulong uVar13;
  size_type sVar14;
  size_type sVar15;
  time_point tVar16;
  ulong uVar17;
  unsigned_long uVar18;
  pointer __x;
  pointer __x_00;
  string *__str;
  char cVar19;
  Hypergraph *pHVar20;
  pointer pdVar21;
  int iVar22;
  string *__str_2;
  uint uVar23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  s;
  edge_vec t;
  edge intersection;
  edge e;
  string *__str_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> iteration_position;
  vector<unsigned_long,_std::allocator<unsigned_long>_> x_index_to_s_index;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_428;
  allocator_type local_409;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_408;
  edge *local_3e8;
  pointer local_3e0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_3d8;
  string local_3b8;
  string local_398;
  undefined1 *local_378 [2];
  undefined1 local_368 [16];
  string local_358;
  string local_338;
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  char *local_2d8;
  uint local_2d0;
  char local_2c8 [16];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  char *local_278;
  uint local_270;
  char local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [24];
  undefined1 **local_230;
  Table *local_228;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_220;
  undefined1 **local_200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  undefined1 local_1e0 [48];
  undefined1 local_1b0 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  undefined1 local_168 [48];
  undefined1 local_138 [48];
  undefined1 local_108 [72];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  undefined1 local_a8 [72];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((this->m_configuration).collect_oracle_statistics == true) {
    rVar11 = std::chrono::_V2::system_clock::now();
    (this->m_oracle_timestamp).__d.__r = rVar11;
  }
  puVar3 = (x->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)(x->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  if (lVar12 == 0) {
LAB_00130815:
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,y);
    bVar7 = is_hitting_set(this,(edge *)&local_3b8);
    bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8);
    if (bVar8) {
      if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_3b8._M_dataplus._M_p);
      }
      bVar8 = (this->m_configuration).collect_oracle_statistics;
      if (bVar7) {
        if (bVar8 == false) {
          return 1;
        }
        tVar16.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        edge_to_string_abi_cxx11_(&local_3b8,x);
        edge_to_string_abi_cxx11_(&local_398,y);
        local_378[0] = local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"3","");
        ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar16);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
        local_318[0] = local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
        local_2f8[0] = local_2e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"");
        local_2d8 = local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
        local_278 = local_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
        __l_00._M_len = 0xc;
        __l_00._M_array = &local_3b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_60,__l_00,(allocator_type *)&local_3d8);
        Table::add_record(&this->m_oracle_stats,&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        lVar12 = 0;
        do {
          if (local_248 + lVar12 != *(undefined1 **)((long)local_258 + lVar12)) {
            operator_delete(*(undefined1 **)((long)local_258 + lVar12));
          }
          lVar12 = lVar12 + -0x20;
        } while (lVar12 != -0x180);
        return 1;
      }
      if (bVar8 == false) {
        return 0;
      }
      tVar16.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      edge_to_string_abi_cxx11_(&local_3b8,x);
      edge_to_string_abi_cxx11_(&local_398,y);
      local_378[0] = local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"4","");
      ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar16);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
      local_318[0] = local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"");
      local_2d8 = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
      local_278 = local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
      __l_01._M_len = 0xc;
      __l_01._M_array = &local_3b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_a8 + 0x30),__l_01,(allocator_type *)&local_3d8);
      Table::add_record(&this->m_oracle_stats,(record *)(local_a8 + 0x30));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_a8 + 0x30));
      lVar12 = 0;
      do {
        if (local_248 + lVar12 != *(undefined1 **)((long)local_258 + lVar12)) {
          operator_delete(*(undefined1 **)((long)local_258 + lVar12));
        }
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != -0x180);
      return 0;
    }
LAB_00131a44:
    __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                  0x2be,
                  "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                 );
  }
  uVar13 = lVar12 >> 3;
  if (*puVar3 == 0) {
    uVar17 = 0;
    do {
      if ((uVar13 + (uVar13 == 0)) - 1 == uVar17) goto LAB_00130815;
      uVar1 = uVar17 + 1;
      lVar12 = uVar17 + 1;
      uVar17 = uVar1;
    } while (puVar3[lVar12] == 0);
    if (uVar13 <= uVar1) goto LAB_00130815;
  }
  local_408.
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(x);
  local_3b8.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p = (pointer)0x0;
  local_3b8._M_string_length = 0;
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::vector(&local_428,sVar14,(value_type *)&local_3b8,(allocator_type *)&local_3d8);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_3b8);
  local_3b8._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1f8,(long)this->m_num_vertices,(value_type_conflict1 *)&local_3b8,
             (allocator_type *)&local_3d8);
  sVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from(x,0)
  ;
  uVar18 = 0;
  for (; sVar14 != 0xffffffffffffffff;
      sVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                         (x,sVar14)) {
    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[sVar14] = uVar18;
    uVar18 = uVar18 + 1;
  }
  pdVar21 = (this->m_edges).
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_3e0 = (this->m_edges).
              super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_3e8 = x;
  if (pdVar21 != local_3e0) {
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,
                 &pdVar21->m_bits);
      local_3b8.field_2._8_8_ = pdVar21->m_num_bits;
      boost::operator&(&local_3d8,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,x
                      );
      if ((long)local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0012fd72:
        boost::operator-(&local_220,
                         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8
                         ,y);
        std::
        vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
        ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                  ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                    *)&local_408,&local_220);
        bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_220);
LAB_0012fd97:
        if (bVar7 == false) goto LAB_00131a44;
        if (local_220.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_220.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else {
        uVar13 = (long)local_3d8.m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_3d8.m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        if (*local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start == 0) {
          uVar17 = 0;
          do {
            if ((uVar13 + (uVar13 == 0)) - 1 == uVar17) goto LAB_0012fd72;
            uVar1 = uVar17 + 1;
            lVar12 = uVar17 + 1;
            uVar17 = uVar1;
          } while (local_3d8.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12] == 0);
          if (uVar13 <= uVar1) goto LAB_0012fd72;
        }
        sVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                           (&local_3d8);
        if (sVar14 == 1) {
          sVar15 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                   m_do_find_from(&local_3d8,0);
          pvVar4 = local_428.
                   super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[sVar15];
          boost::operator-(&local_220,
                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &local_3b8,y);
          std::
          vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
          ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                    ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                      *)(pvVar4 + uVar18),&local_220);
          bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants(&local_220);
          x = local_3e8;
          goto LAB_0012fd97;
        }
      }
      bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_3d8);
      if (!bVar7) goto LAB_00131a44;
      if (local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d8.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_3b8);
      if (!bVar7) goto LAB_00131a44;
      if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_3b8._M_dataplus._M_p);
      }
      pdVar21 = pdVar21 + 1;
    } while (pdVar21 != local_3e0);
  }
  pvVar4 = local_428.
           super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_428.
      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_428.
      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __x = local_428.
          super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&local_3d8,__x);
      if (local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start ==
          local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        if ((this->m_configuration).collect_oracle_statistics != true) goto LAB_00131190;
        tVar16.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        edge_to_string_abi_cxx11_(&local_3b8,local_3e8);
        edge_to_string_abi_cxx11_(&local_398,y);
        local_378[0] = local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"10","");
        ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar16);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
        local_318[0] = local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
        local_2f8[0] = local_2e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"");
        local_2d8 = local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"0","");
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"0","");
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"0","");
        uVar13 = (long)local_408.
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_408.
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        cVar19 = '\x01';
        if (uVar13 < 10) goto LAB_0013102b;
        uVar17 = uVar13;
        cVar6 = '\x04';
        goto LAB_00130e74;
      }
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&local_3d8);
      __x = __x + 1;
    } while (__x != pvVar4);
  }
  e_00 = local_3e8;
  bVar7 = (this->m_configuration).collect_oracle_statistics;
  if (local_408.
      super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_408.
      super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar22 = 2;
    if (bVar7 != false) {
      tVar16.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      edge_to_string_abi_cxx11_(&local_3b8,e_00);
      edge_to_string_abi_cxx11_(&local_398,y);
      local_378[0] = local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"11","");
      ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar16);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
      local_318[0] = local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"");
      pHVar20 = (Hypergraph *)(local_108 + 0x30);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar20,&local_428);
      uVar10 = maximum_iteration_count
                         (pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   *)(local_108 + 0x30));
      uVar2 = -uVar10;
      if (0 < (int)uVar10) {
        uVar2 = uVar10;
      }
      uVar23 = 1;
      if (9 < uVar2) {
        uVar13 = (ulong)uVar2;
        uVar5 = 4;
        do {
          uVar23 = uVar5;
          uVar9 = (uint)uVar13;
          if (uVar9 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_001311ab;
          }
          if (uVar9 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_001311ab;
          }
          if (uVar9 < 10000) goto LAB_001311ab;
          uVar13 = uVar13 / 10000;
          uVar5 = uVar23 + 4;
        } while (99999 < uVar9);
        uVar23 = uVar23 + 1;
      }
LAB_001311ab:
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct
                ((ulong)local_2f8,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_2f8[0] + (uVar10 >> 0x1f),uVar23,uVar2);
      uVar13 = ((long)local_428.
                      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_428.
                      super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      cVar19 = '\x01';
      if (9 < uVar13) {
        uVar17 = uVar13;
        cVar6 = '\x04';
        do {
          cVar19 = cVar6;
          if (uVar17 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_0013125b;
          }
          if (uVar17 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_0013125b;
          }
          if (uVar17 < 10000) goto LAB_0013125b;
          bVar7 = 99999 < uVar17;
          uVar17 = uVar17 / 10000;
          cVar6 = cVar19 + '\x04';
        } while (bVar7);
        cVar19 = cVar19 + '\x01';
      }
LAB_0013125b:
      local_2d8 = local_2c8;
      std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_2d8,local_2d0,uVar13);
      pHVar20 = (Hypergraph *)(local_108 + 0x18);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar20,&local_428);
      uVar10 = summed_sx_sizes(pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                        *)(local_108 + 0x18));
      uVar2 = -uVar10;
      if (0 < (int)uVar10) {
        uVar2 = uVar10;
      }
      uVar23 = 1;
      if (9 < uVar2) {
        uVar13 = (ulong)uVar2;
        uVar5 = 4;
        do {
          uVar23 = uVar5;
          uVar9 = (uint)uVar13;
          if (uVar9 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_00131308;
          }
          if (uVar9 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_00131308;
          }
          if (uVar9 < 10000) goto LAB_00131308;
          uVar13 = uVar13 / 10000;
          uVar5 = uVar23 + 4;
        } while (99999 < uVar9);
        uVar23 = uVar23 + 1;
      }
LAB_00131308:
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct
                ((ulong)local_2b8,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_2b8[0] + (uVar10 >> 0x1f),uVar23,uVar2);
      pHVar20 = (Hypergraph *)local_108;
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)pHVar20,&local_428);
      uVar10 = total_number_of_vertices_in_s
                         (pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   *)local_108);
      uVar2 = -uVar10;
      if (0 < (int)uVar10) {
        uVar2 = uVar10;
      }
      uVar23 = 1;
      if (9 < uVar2) {
        uVar13 = (ulong)uVar2;
        uVar5 = 4;
        do {
          uVar23 = uVar5;
          uVar9 = (uint)uVar13;
          if (uVar9 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_001313bf;
          }
          if (uVar9 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_001313bf;
          }
          if (uVar9 < 10000) goto LAB_001313bf;
          uVar13 = uVar13 / 10000;
          uVar5 = uVar23 + 4;
        } while (99999 < uVar9);
        uVar23 = uVar23 + 1;
      }
LAB_001313bf:
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct
                ((ulong)local_298,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_298[0] + (uVar10 >> 0x1f),uVar23,uVar2);
      local_278 = local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"0","");
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"0","");
      __l_03._M_len = 0xc;
      __l_03._M_array = &local_3b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c0,__l_03,(allocator_type *)&local_3d8);
      Table::add_record(&this->m_oracle_stats,&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      lVar12 = 0;
      do {
        if (local_248 + lVar12 != *(undefined1 **)((long)local_258 + lVar12)) {
          operator_delete(*(undefined1 **)((long)local_258 + lVar12));
        }
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != -0x180);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)local_108);
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)(local_108 + 0x18));
      std::
      vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)(local_108 + 0x30));
    }
  }
  else {
    if (bVar7 != false) {
      this->m_iteration_count = 0;
      rVar11 = std::chrono::_V2::system_clock::now();
      (this->m_oracle_bf_timestamp).__d.__r = rVar11;
    }
    sVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(e_00);
    local_3b8._M_dataplus._M_p = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_220.m_bits,sVar14,(value_type_conflict1 *)&local_3b8,
               (allocator_type *)&local_3d8);
    local_228 = &this->m_oracle_stats;
    local_200 = local_318;
    local_230 = local_258;
    local_3e0 = (pointer)0x0;
    do {
      if ((this->m_configuration).collect_oracle_statistics == true) {
        this->m_iteration_count = this->m_iteration_count + 1;
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_3d8,(long)this->m_num_vertices,0,(allocator<unsigned_long> *)&local_3b8);
      if (local_428.
          super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_428.
          super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar22 = 10;
        __x_00 = local_408.
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar21 = local_408.
                  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        bVar7 = true;
        lVar12 = 0;
        uVar13 = 0;
        do {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
                    (&local_3d8,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (local_220.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar13] * 0x20 +
                     *(long *)((long)&((local_428.
                                        super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar12)));
          if (bVar7) {
            uVar18 = local_220.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
            local_220.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar13] = uVar18 + 1;
            if (uVar18 + 1 ==
                *(long *)((long)&((local_428.
                                   super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar12) -
                *(long *)((long)&((local_428.
                                   super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar12) >> 5) {
              local_220.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar13] = 0;
            }
            else {
              bVar7 = false;
            }
          }
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x18;
        } while (uVar13 < (ulong)(((long)local_428.
                                         super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_428.
                                         super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
        iVar22 = 0;
        __x_00 = local_408.
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar21 = local_408.
                  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar7) {
          iVar22 = 10;
        }
      }
      for (; __x_00 != pdVar21; __x_00 = __x_00 + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,
                   &__x_00->m_bits);
        local_3b8.field_2._8_8_ = __x_00->m_num_bits;
        bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &local_3b8,&local_3d8);
        bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_3b8);
        if (!bVar8) goto LAB_00131a44;
        if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_3b8._M_dataplus._M_p);
        }
        if (bVar7) goto LAB_0013069e;
      }
      iVar22 = 1;
      local_3e0 = (pointer)0x1;
      if ((this->m_configuration).collect_oracle_statistics == true) {
        tVar16.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        edge_to_string_abi_cxx11_(&local_3b8,local_3e8);
        edge_to_string_abi_cxx11_(&local_398,y);
        local_378[0] = local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"14","");
        ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar16);
        ns_string_abi_cxx11_(&local_338,(time_point)(this->m_oracle_bf_timestamp).__d.__r,tVar16);
        uVar2 = this->m_iteration_count;
        uVar10 = -uVar2;
        if (0 < (int)uVar2) {
          uVar10 = uVar2;
        }
        uVar23 = 1;
        if (9 < uVar10) {
          uVar13 = (ulong)uVar10;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_00130151;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_00130151;
            }
            if (uVar9 < 10000) goto LAB_00130151;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_00130151:
        local_318[0] = local_308;
        std::__cxx11::string::_M_construct
                  ((ulong)local_200,(char)uVar23 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_318[0] + (uVar2 >> 0x1f),uVar23,uVar10);
        pHVar20 = (Hypergraph *)(local_138 + 0x18);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)pHVar20,&local_428);
        uVar10 = maximum_iteration_count
                           (pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     *)(local_138 + 0x18));
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar23 = 1;
        if (9 < uVar2) {
          uVar13 = (ulong)uVar2;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_00130216;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_00130216;
            }
            if (uVar9 < 10000) goto LAB_00130216;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_00130216:
        local_2f8[0] = local_2e8;
        std::__cxx11::string::_M_construct
                  ((ulong)local_2f8,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_2f8[0] + (uVar10 >> 0x1f),uVar23,uVar2);
        uVar13 = ((long)local_428.
                        super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_428.
                        super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        cVar19 = '\x01';
        if (9 < uVar13) {
          uVar17 = uVar13;
          cVar6 = '\x04';
          do {
            cVar19 = cVar6;
            if (uVar17 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_001302cd;
            }
            if (uVar17 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_001302cd;
            }
            if (uVar17 < 10000) goto LAB_001302cd;
            bVar7 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar6 = cVar19 + '\x04';
          } while (bVar7);
          cVar19 = cVar19 + '\x01';
        }
LAB_001302cd:
        local_2d8 = local_2c8;
        std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_2d8,local_2d0,uVar13);
        pHVar20 = (Hypergraph *)local_138;
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)pHVar20,&local_428);
        uVar10 = summed_sx_sizes(pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                          *)local_138);
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar23 = 1;
        if (9 < uVar2) {
          uVar13 = (ulong)uVar2;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_0013038c;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_0013038c;
            }
            if (uVar9 < 10000) goto LAB_0013038c;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_0013038c:
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct
                  ((ulong)local_2b8,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_2b8[0] + (uVar10 >> 0x1f),uVar23,uVar2);
        pHVar20 = (Hypergraph *)(local_168 + 0x18);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)pHVar20,&local_428);
        uVar10 = total_number_of_vertices_in_s
                           (pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     *)(local_168 + 0x18));
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar23 = 1;
        if (9 < uVar2) {
          uVar13 = (ulong)uVar2;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_00130451;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_00130451;
            }
            if (uVar9 < 10000) goto LAB_00130451;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_00130451:
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct
                  ((ulong)local_298,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_298[0] + (uVar10 >> 0x1f),uVar23,uVar2);
        uVar13 = (long)local_408.
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_408.
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        cVar19 = '\x01';
        if (9 < uVar13) {
          uVar17 = uVar13;
          cVar6 = '\x04';
          do {
            cVar19 = cVar6;
            if (uVar17 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_001304fa;
            }
            if (uVar17 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_001304fa;
            }
            if (uVar17 < 10000) goto LAB_001304fa;
            bVar7 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar6 = cVar19 + '\x04';
          } while (bVar7);
          cVar19 = cVar19 + '\x01';
        }
LAB_001304fa:
        local_278 = local_268;
        std::__cxx11::string::_M_construct((ulong)&local_278,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_278,local_270,uVar13);
        pHVar20 = (Hypergraph *)local_168;
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)pHVar20,&local_408);
        uVar10 = total_number_of_vertices_in_t(pHVar20,(edge_vec *)local_168);
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar23 = 1;
        if (9 < uVar2) {
          uVar13 = (ulong)uVar2;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_001305b1;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_001305b1;
            }
            if (uVar9 < 10000) goto LAB_001305b1;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_001305b1:
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct
                  ((ulong)local_258,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_258[0] + (uVar10 >> 0x1f),uVar23,uVar2);
        __l._M_len = 0xc;
        __l._M_array = &local_3b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,__l,&local_409);
        Table::add_record(local_228,&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        lVar12 = 0;
        do {
          if (local_248 + lVar12 != *(undefined1 **)((long)local_258 + lVar12)) {
            operator_delete(*(undefined1 **)((long)local_258 + lVar12));
          }
          lVar12 = lVar12 + -0x20;
        } while (lVar12 != -0x180);
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)local_168);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)(local_168 + 0x18));
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)local_138);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)(local_138 + 0x18));
        iVar22 = 1;
        local_3e0 = (pointer)0x1;
      }
LAB_0013069e:
      bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_3d8);
      if (!bVar7) goto LAB_00131a44;
      if (local_3d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d8.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (iVar22 == 0);
    if (iVar22 == 10) {
      iVar22 = 0;
      if ((this->m_configuration).collect_oracle_statistics == true) {
        tVar16.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        edge_to_string_abi_cxx11_(&local_3b8,local_3e8);
        edge_to_string_abi_cxx11_(&local_398,y);
        local_378[0] = local_368;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"15","");
        ns_string_abi_cxx11_(&local_358,(time_point)(this->m_oracle_timestamp).__d.__r,tVar16);
        ns_string_abi_cxx11_(&local_338,(time_point)(this->m_oracle_bf_timestamp).__d.__r,tVar16);
        uVar2 = this->m_iteration_count;
        uVar10 = -uVar2;
        if (0 < (int)uVar2) {
          uVar10 = uVar2;
        }
        uVar23 = 1;
        if (9 < uVar10) {
          uVar13 = (ulong)uVar10;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_001314ec;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_001314ec;
            }
            if (uVar9 < 10000) goto LAB_001314ec;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_001314ec:
        local_318[0] = local_308;
        std::__cxx11::string::_M_construct
                  ((ulong)local_318,(char)uVar23 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_318[0] + (uVar2 >> 0x1f),uVar23,uVar10);
        pHVar20 = (Hypergraph *)(local_1b0 + 0x18);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)pHVar20,&local_428);
        uVar10 = maximum_iteration_count
                           (pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     *)(local_1b0 + 0x18));
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar23 = 1;
        if (9 < uVar2) {
          uVar13 = (ulong)uVar2;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_001315b0;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_001315b0;
            }
            if (uVar9 < 10000) goto LAB_001315b0;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_001315b0:
        local_2f8[0] = local_2e8;
        std::__cxx11::string::_M_construct
                  ((ulong)local_2f8,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_2f8[0] + (uVar10 >> 0x1f),uVar23,uVar2);
        uVar13 = ((long)local_428.
                        super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_428.
                        super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        cVar19 = '\x01';
        if (9 < uVar13) {
          uVar17 = uVar13;
          cVar6 = '\x04';
          do {
            cVar19 = cVar6;
            if (uVar17 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_0013165a;
            }
            if (uVar17 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_0013165a;
            }
            if (uVar17 < 10000) goto LAB_0013165a;
            bVar7 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar6 = cVar19 + '\x04';
          } while (bVar7);
          cVar19 = cVar19 + '\x01';
        }
LAB_0013165a:
        local_2d8 = local_2c8;
        std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_2d8,local_2d0,uVar13);
        pHVar20 = (Hypergraph *)local_1b0;
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)pHVar20,&local_428);
        uVar10 = summed_sx_sizes(pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                          *)local_1b0);
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar23 = 1;
        if (9 < uVar2) {
          uVar13 = (ulong)uVar2;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_0013170b;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_0013170b;
            }
            if (uVar9 < 10000) goto LAB_0013170b;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_0013170b:
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct
                  ((ulong)local_2b8,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_2b8[0] + (uVar10 >> 0x1f),uVar23,uVar2);
        pHVar20 = (Hypergraph *)(local_1e0 + 0x18);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)pHVar20,&local_428);
        uVar10 = total_number_of_vertices_in_s
                           (pHVar20,(vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     *)(local_1e0 + 0x18));
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar23 = 1;
        if (9 < uVar2) {
          uVar13 = (ulong)uVar2;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_001317c6;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_001317c6;
            }
            if (uVar9 < 10000) goto LAB_001317c6;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_001317c6:
        local_298[0] = local_288;
        std::__cxx11::string::_M_construct
                  ((ulong)local_298,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_298[0] + (uVar10 >> 0x1f),uVar23,uVar2);
        uVar13 = (long)local_408.
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_408.
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        cVar19 = '\x01';
        if (9 < uVar13) {
          uVar17 = uVar13;
          cVar6 = '\x04';
          do {
            cVar19 = cVar6;
            if (uVar17 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_0013186c;
            }
            if (uVar17 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_0013186c;
            }
            if (uVar17 < 10000) goto LAB_0013186c;
            bVar7 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar6 = cVar19 + '\x04';
          } while (bVar7);
          cVar19 = cVar19 + '\x01';
        }
LAB_0013186c:
        local_278 = local_268;
        std::__cxx11::string::_M_construct((ulong)&local_278,cVar19);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_278,local_270,uVar13);
        pHVar20 = (Hypergraph *)local_1e0;
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)pHVar20,&local_408);
        uVar10 = total_number_of_vertices_in_t(pHVar20,(edge_vec *)local_1e0);
        uVar2 = -uVar10;
        if (0 < (int)uVar10) {
          uVar2 = uVar10;
        }
        uVar23 = 1;
        if (9 < uVar2) {
          uVar13 = (ulong)uVar2;
          uVar5 = 4;
          do {
            uVar23 = uVar5;
            uVar9 = (uint)uVar13;
            if (uVar9 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_0013191d;
            }
            if (uVar9 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_0013191d;
            }
            if (uVar9 < 10000) goto LAB_0013191d;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar23 + 4;
          } while (99999 < uVar9);
          uVar23 = uVar23 + 1;
        }
LAB_0013191d:
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct
                  ((ulong)local_258,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_258[0] + (uVar10 >> 0x1f),uVar23,uVar2);
        __l_04._M_len = 0xc;
        __l_04._M_array = &local_3b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_180,__l_04,(allocator_type *)&local_3d8);
        Table::add_record(local_228,&local_180);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_180);
        lVar12 = 0;
        do {
          if (local_248 + lVar12 != *(undefined1 **)((long)local_258 + lVar12)) {
            operator_delete(*(undefined1 **)((long)local_258 + lVar12));
          }
          lVar12 = lVar12 + -0x20;
        } while (lVar12 != -0x180);
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)local_1e0);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)(local_1e0 + 0x18));
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)local_1b0);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *)(local_1b0 + 0x18));
        iVar22 = 0;
      }
    }
    else {
      iVar22 = (int)local_3e0;
    }
    if (local_220.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  goto LAB_00131a09;
  while( true ) {
    if (uVar17 < 10000) goto LAB_0013102b;
    bVar7 = uVar17 < 100000;
    uVar17 = uVar17 / 10000;
    cVar6 = cVar19 + '\x04';
    if (bVar7) break;
LAB_00130e74:
    cVar19 = cVar6;
    if (uVar17 < 100) {
      cVar19 = cVar19 + -2;
      goto LAB_0013102b;
    }
    if (uVar17 < 1000) {
      cVar19 = cVar19 + -1;
      goto LAB_0013102b;
    }
  }
  cVar19 = cVar19 + '\x01';
LAB_0013102b:
  local_278 = local_268;
  std::__cxx11::string::_M_construct((ulong)&local_278,cVar19);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_278,local_270,uVar13);
  pHVar20 = (Hypergraph *)local_a8;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)pHVar20,&local_408);
  uVar10 = total_number_of_vertices_in_t(pHVar20,(edge_vec *)local_a8);
  uVar2 = -uVar10;
  if (0 < (int)uVar10) {
    uVar2 = uVar10;
  }
  uVar23 = 1;
  if (9 < uVar2) {
    uVar13 = (ulong)uVar2;
    uVar5 = 4;
    do {
      uVar23 = uVar5;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar23 = uVar23 - 2;
        goto LAB_001310d7;
      }
      if (uVar9 < 1000) {
        uVar23 = uVar23 - 1;
        goto LAB_001310d7;
      }
      if (uVar9 < 10000) goto LAB_001310d7;
      uVar13 = uVar13 / 10000;
      uVar5 = uVar23 + 4;
    } while (99999 < uVar9);
    uVar23 = uVar23 + 1;
  }
LAB_001310d7:
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct((ulong)local_258,(char)uVar23 - (char)((int)uVar10 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_258[0] + (uVar10 >> 0x1f),uVar23,uVar2);
  __l_02._M_len = 0xc;
  __l_02._M_array = &local_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_a8 + 0x18),__l_02,(allocator_type *)&local_220);
  Table::add_record(&this->m_oracle_stats,(record *)(local_a8 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a8 + 0x18));
  lVar12 = 0;
  do {
    if (local_248 + lVar12 != *(undefined1 **)((long)local_258 + lVar12)) {
      operator_delete(*(undefined1 **)((long)local_258 + lVar12));
    }
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x180);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_a8);
LAB_00131190:
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_3d8);
  iVar22 = 0;
LAB_00131a09:
  if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&local_428);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_408);
  return iVar22;
}

Assistant:

int Hypergraph::extendable(const edge &x, const edge &y) {
	if (m_configuration.collect_oracle_statistics) m_oracle_timestamp = Clock::now();
	// 2
	if (x.none()) {
		// 3
		if (is_hitting_set(~y)) {
			if (m_configuration.collect_oracle_statistics) {
				auto now = Clock::now();
				m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "3", ns_string(m_oracle_timestamp, now), "", "", "", "", "", "", "", "" });
			}
			return EXTENDABLE;
		}
		// 4
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "4", ns_string(m_oracle_timestamp, now), "", "", "", "", "", "", "", "" });
		}
		return NOT_EXTENDABLE;
	}
	// 5
	edge_vec t;
	// 6
	std::vector<edge_vec> s(x.count(), edge_vec());
	std::vector<std::vector<edge_vec>::size_type> x_index_to_s_index(m_num_vertices, -1);
	std::vector<edge_vec>::size_type s_index = -1;
	for (auto x_index = x.find_first(); x_index != edge::npos; x_index = x.find_next(x_index)) x_index_to_s_index[x_index] = ++s_index;
	// 7
	for (edge e : m_edges) {
		edge intersection = e & x;
		// 9
		if (intersection.none()) {
			t.push_back(e - y);
			continue;
		}
		// 8
		if (intersection.count() == 1) s[x_index_to_s_index[intersection.find_first()]].push_back(e - y);
	}
	// 10
	for (auto sx : s) if (sx.empty()) {
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "10", ns_string(m_oracle_timestamp, now), "", "", "", "0", "0", "0", std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
		}
		return NOT_EXTENDABLE;
	}
	// 11
	if (t.empty()) {
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "11", ns_string(m_oracle_timestamp, now), "", "", std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), "0", "0" });
		}
		return MINIMAL;
	}
	// 12
	if (m_configuration.collect_oracle_statistics) {
		m_iteration_count = 0;
		m_oracle_bf_timestamp = Clock::now();
	}
	std::vector<edge::size_type> iteration_position(x.count(), 0);
	while (true) {
		if (m_configuration.collect_oracle_statistics) m_iteration_count++;
		// 13
		edge w(m_num_vertices);
		bool increase_next = true;
		for (std::vector<edge_vec>::size_type i_s = 0; i_s < s.size(); ++i_s) {
			w |= s[i_s][iteration_position[i_s]];
			if (increase_next) {
				++iteration_position[i_s];
				if (iteration_position[i_s] == s[i_s].size()) iteration_position[i_s] = 0;
				else increase_next = false;
			}
		}
		// 14
		bool all_no_subset = true;
		for (edge e : t) {
			if (e.is_subset_of(w)) {
				all_no_subset = false;
				break;
			}
		}
		if (all_no_subset) {
			if (m_configuration.collect_oracle_statistics) {
				auto now = Clock::now();
				m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "14", ns_string(m_oracle_timestamp, now), ns_string(m_oracle_bf_timestamp, now), std::to_string(m_iteration_count), std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
			}
			return EXTENDABLE;
		}
		if (increase_next) break;
	}
	// 15
	if (m_configuration.collect_oracle_statistics) {
		auto now = Clock::now();
		m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "15", ns_string(m_oracle_timestamp, now), ns_string(m_oracle_bf_timestamp, now), std::to_string(m_iteration_count), std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
	}
	return NOT_EXTENDABLE;
}